

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::reserve
          (QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  pair<QModelIndex,_QPersistentModelIndex> *in_stack_ffffffffffffff60;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *in_stack_ffffffffffffff68;
  pair<QModelIndex,_QPersistentModelIndex> *b;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  pair<QModelIndex,_QPersistentModelIndex> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x87ee55);
  qVar3 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::freeSpaceAtBegin
                    (in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::flags
                   ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                    in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_0087f031;
    QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::isShared
                      ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                       in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::setFlag
                ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x87ef0f,
                 (ArrayOptions)in_stack_ffffffffffffff5c.i);
      goto LAB_0087f031;
    }
  }
  local_38.first._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38.first.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_38.first.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  b = &local_38;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)b >> 0x20));
  this_00 = (QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
            QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator->
                      ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)b);
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator->(in_RDI);
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::begin
            ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x87ef91);
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator->(in_RDI);
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::end
            ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
             in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::copyAppend
            (this_00,b,in_stack_ffffffffffffff60);
  pDVar4 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::d_ptr
                     ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)&local_38
                     );
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (pair<QModelIndex,_QPersistentModelIndex> *)
         QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator->
                   ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::setFlag
              ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x87eff8,
               (ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::swap
            ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
             in_stack_ffffffffffffff60,
             (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::~QArrayDataPointer
            ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
             in_stack_ffffffffffffff60);
LAB_0087f031:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}